

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

int Extra_Power3(int Num)

{
  int iVar1;
  
  iVar1 = 1;
  if (0 < Num) {
    do {
      iVar1 = iVar1 * 3;
      Num = Num + -1;
    } while (Num != 0);
  }
  return iVar1;
}

Assistant:

int Extra_Power3( int Num )
{
    int i;
    int Res;
    Res = 1;
    for ( i = 0; i < Num; i++ )
        Res *= 3;
    return Res;
}